

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_len(uchar **p,uchar *start,size_t len)

{
  uchar *puVar1;
  ulong local_38;
  size_t l;
  size_t sStack_28;
  int required;
  size_t len_local;
  uchar *start_local;
  uchar **p_local;
  
  if (len < 0x100000000) {
    l._4_4_ = 1;
    local_38 = len;
    if (0x7f < len) {
      for (; local_38 != 0; local_38 = local_38 >> 8) {
        l._4_4_ = l._4_4_ + 1;
      }
    }
    sStack_28 = len;
    if ((long)*p - (long)start < (long)l._4_4_) {
      p_local._4_4_ = -0x6c;
    }
    else {
      do {
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = (uchar)sStack_28;
        sStack_28 = sStack_28 >> 8;
      } while (sStack_28 != 0);
      if (1 < l._4_4_) {
        puVar1 = *p;
        *p = puVar1 + -1;
        puVar1[-1] = (char)l._4_4_ + '\x7f';
      }
      p_local._4_4_ = l._4_4_;
    }
  }
  else {
    p_local._4_4_ = -100;
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_len(unsigned char **p, const unsigned char *start, size_t len)
{
#if SIZE_MAX > 0xFFFFFFFF
    if (len > 0xFFFFFFFF) {
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }
#endif

    int required = 1;

    if (len >= 0x80) {
        for (size_t l = len; l != 0; l >>= 8) {
            required++;
        }
    }

    if (required > (*p - start)) {
        return MBEDTLS_ERR_ASN1_BUF_TOO_SMALL;
    }

    do {
        *--(*p) = MBEDTLS_BYTE_0(len);
        len >>= 8;
    } while (len);

    if (required > 1) {
        *--(*p) = (unsigned char) (0x80 + required - 1);
    }

    return required;
}